

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_0::printFloatDeclaration
               (ostringstream *oss,string *varName,bool uniform,GLfloat value)

{
  ostream *poVar1;
  int precision;
  undefined7 in_register_00000011;
  VarType varType;
  string local_c8;
  VarType local_a8;
  VariableDeclaration local_90;
  Layout local_2c;
  
  glu::VarType::VarType(&local_a8,TYPE_FLOAT,PRECISION_HIGHP);
  if ((int)CONCAT71(in_register_00000011,uniform) == 0) {
    glu::Layout::Layout(&local_2c,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_90,&local_a8,varName,STORAGE_CONST,INTERPOLATION_LAST,&local_2c,0);
    poVar1 = glu::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
    de::floatToString_abi_cxx11_(&local_c8,(de *)0x6,value,precision);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar1,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    glu::Layout::Layout((Layout *)&local_c8,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_90,&local_a8,varName,STORAGE_UNIFORM,INTERPOLATION_LAST,(Layout *)&local_c8,0)
    ;
    poVar1 = glu::operator<<(&oss->super_basic_ostream<char,_std::char_traits<char>_>,&local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.name._M_dataplus._M_p != &local_90.name.field_2) {
    operator_delete(local_90.name._M_dataplus._M_p,local_90.name.field_2._M_allocated_capacity + 1);
  }
  glu::VarType::~VarType(&local_90.varType);
  glu::VarType::~VarType(&local_a8);
  return;
}

Assistant:

void printFloatDeclaration (ostringstream&	oss,
							const string&	varName,
							bool			uniform,
							GLfloat			value		= 0.0)
{
	using namespace glu;

	const VarType	varType	(TYPE_FLOAT, PRECISION_HIGHP);

	if (uniform)
		oss << VariableDeclaration(varType, varName, STORAGE_UNIFORM) << ";\n";
	else
		oss << VariableDeclaration(varType, varName, STORAGE_CONST)
			<< " = " << de::floatToString(value, 6) << ";\n";
}